

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference __rhs;
  const_reference name;
  undefined1 local_e0 [8];
  string e;
  bool result;
  string *outvar;
  string *right;
  string *left;
  undefined1 local_98 [8];
  string e_1;
  string mode;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command COMPARE requires a mode to be specified.",&local_41)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,1);
    std::__cxx11::string::string((string *)(e_1.field_2._M_local_buf + 8),(string *)pvVar4);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (e_1.field_2._M_local_buf + 8),"EQUAL");
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&e_1.field_2 + 8),"NOTEQUAL"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&e_1.field_2 + 8),"LESS"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&e_1.field_2 + 8),"GREATER"), bVar1)) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar3 < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_98,"sub-command COMPARE, mode ",(allocator *)((long)&left + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&left + 7));
        std::__cxx11::string::operator+=
                  ((string *)local_98,(string *)(e_1.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=
                  ((string *)local_98," needs at least 5 arguments total to command.");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_98);
        this_local._7_1_ = 0;
        left._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,2);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,3);
        name = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&e_1.field_2 + 8),"LESS");
        if (bVar1) {
          e.field_2._M_local_buf[0xf] = std::operator<(pvVar4,__rhs);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&e_1.field_2 + 8),"GREATER");
          if (bVar1) {
            e.field_2._M_local_buf[0xf] = std::operator>(pvVar4,__rhs);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&e_1.field_2 + 8),"EQUAL");
            if (bVar1) {
              e.field_2._M_local_buf[0xf] = std::operator==(pvVar4,__rhs);
            }
            else {
              _Var2 = std::operator==(pvVar4,__rhs);
              e.field_2._M_local_buf[0xf] = (_Var2 ^ 0xffU) & 1;
            }
          }
        }
        if (e.field_2._M_local_buf[0xf] == '\0') {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"0");
        }
        else {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"1");
        }
        this_local._7_1_ = 1;
        left._0_4_ = 1;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "sub-command COMPARE does not recognize mode ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&e_1.field_2 + 8));
      cmCommand::SetError(&this->super_cmCommand,(string *)local_e0);
      this_local._7_1_ = 0;
      left._0_4_ = 1;
      std::__cxx11::string::~string((string *)local_e0);
    }
    std::__cxx11::string::~string((string *)(e_1.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleCompareCommand(std::vector<std::string> const&
                                           args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
    }
  std::string mode = args[1];
  if((mode == "EQUAL") || (mode == "NOTEQUAL") ||
     (mode == "LESS") || (mode == "GREATER"))
    {
    if(args.size() < 5)
      {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
      }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if(mode == "LESS")
      {
      result = (left < right);
      }
    else if(mode == "GREATER")
      {
      result = (left > right);
      }
    else if(mode == "EQUAL")
      {
      result = (left == right);
      }
    else // if(mode == "NOTEQUAL")
      {
      result = !(left == right);
      }
    if(result)
      {
      this->Makefile->AddDefinition(outvar, "1");
      }
    else
      {
      this->Makefile->AddDefinition(outvar, "0");
      }
    return true;
    }
  std::string e = "sub-command COMPARE does not recognize mode "+mode;
  this->SetError(e);
  return false;
}